

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O2

QByteArray * __thiscall
QAuthenticatorPrivate::calculateResponse
          (QByteArray *__return_storage_ptr__,QAuthenticatorPrivate *this,
          QByteArrayView requestMethod,QByteArrayView path,QStringView host)

{
  QStringView host_00;
  qsizetype qVar1;
  QAuthenticatorPrivate *pQVar2;
  Data *pDVar3;
  char acVar4 [8];
  char acVar5 [8];
  bool bVar6;
  ushort uVar7;
  int iVar8;
  long lVar9;
  QDataStream *this_00;
  QChar *pQVar10;
  QGssApiHandles *pQVar11;
  gss_name_t pgVar12;
  char *pcVar13;
  Data *pDVar14;
  undefined8 *puVar15;
  QNtlmPhase2Block *this_01;
  QArrayDataPointer<char16_t> *this_02;
  uint uVar16;
  QString *pQVar17;
  long in_FS_OFFSET;
  undefined4 uVar18;
  undefined4 uVar19;
  QByteArrayView challenge;
  QByteArrayView challenge_00;
  QByteArrayView message;
  QByteArrayView message_00;
  QArrayDataPointer<char> local_380;
  QArrayDataPointer<char> local_368;
  qsizetype in_stack_fffffffffffffcb8;
  storage_type_conflict *in_stack_fffffffffffffcc0;
  qsizetype local_338;
  char *pcStack_330;
  QArrayDataPointer<char> local_328;
  QArrayDataPointer<char> local_308;
  QArrayDataPointer<char> local_2e8;
  quint16 avId;
  undefined6 uStack_2c6;
  char *pcStack_2c0;
  undefined1 *local_2b8;
  QArrayDataPointer<char> local_2a8;
  QArrayDataPointer<char> local_288;
  QArrayDataPointer<char> local_268;
  QArrayDataPointer<char16_t> local_248;
  QArrayDataPointer<char> local_228;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  QArrayDataPointer<char> local_1e8;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  QArrayDataPointer<char16_t> local_1c8;
  undefined1 *puStack_1b0;
  undefined1 local_1a8 [36];
  QNtlmBuffer QStack_184;
  QNtlmBuffer QStack_17c;
  undefined1 auStack_174 [8];
  uint uStack_16c;
  QByteArray local_168;
  QByteArray local_150;
  QString local_138;
  QString local_120;
  QString local_108 [2];
  QByteArray local_d8;
  QNtlmPhase2Block local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_328.size = 0;
  local_328.d = (Data *)0x0;
  local_328.ptr = (char *)0x0;
  local_338 = 0;
  pcStack_330 = (char *)0x0;
  switch(this->method) {
  case None:
    goto switchD_00199f67_caseD_0;
  case Basic:
    local_338 = QByteArrayView::lengthHelperCharArray("Basic",6);
    pcStack_330 = "Basic";
    local_1c8.size = (qsizetype)&this->password;
    local_1c8.ptr = (char16_t *)CONCAT71(local_1c8.ptr._1_7_,0x3a);
    this_01 = &local_b8;
    local_1c8.d = (Data *)this;
    QStringBuilderBase<QStringBuilder<QStringBuilder<QString_&,_QLatin1Char>,_QString_&>,_QString>::
    toLatin1((QByteArray *)this_01,
             (QStringBuilderBase<QStringBuilder<QStringBuilder<QString_&,_QLatin1Char>,_QString_&>,_QString>
              *)&local_1c8);
    QByteArray::toBase64((QArrayDataPointer<char> *)local_1a8,this_01,0);
    pDVar3 = local_328.d;
    pcVar13 = (char *)CONCAT26(local_1a8._14_2_,CONCAT24(local_1a8._12_2_,local_1a8._8_4_));
    local_328.d = (Data *)local_1a8._0_8_;
    local_1a8._0_8_ = pDVar3;
    local_1a8._8_4_ = SUB84(local_328.ptr,0);
    local_1a8._12_2_ = (undefined2)((ulong)local_328.ptr >> 0x20);
    local_1a8._14_2_ = (undefined2)((ulong)local_328.ptr >> 0x30);
    qVar1 = CONCAT26(local_1a8._22_2_,CONCAT24(local_1a8._20_2_,local_1a8._16_4_));
    local_1a8._16_4_ = (undefined4)local_328.size;
    local_1a8._20_2_ = (undefined2)((ulong)local_328.size >> 0x20);
    local_1a8._22_2_ = (undefined2)((ulong)local_328.size >> 0x30);
    local_328.ptr = pcVar13;
    local_328.size = qVar1;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_1a8);
    goto LAB_0019a09d;
  case Negotiate:
    local_338 = QByteArrayView::lengthHelperCharArray("Negotiate",10);
    pcStack_330 = "Negotiate";
    if ((this->challenge).d.size != 0) {
      local_1a8._16_4_ = 0;
      local_1a8._20_2_ = 0;
      local_1a8._22_2_ = 0;
      local_1a8[0] = '\0';
      local_1a8[1] = '\0';
      local_1a8[2] = '\0';
      local_1a8[3] = '\0';
      local_1a8[4] = '\0';
      local_1a8[5] = '\0';
      local_1a8[6] = '\0';
      local_1a8[7] = '\0';
      local_1a8._8_4_ = 0;
      local_1a8._12_2_ = 0;
      local_1a8._14_2_ = 0;
      if ((this->gssApiHandles).d != (QGssApiHandles *)0x0) {
        QByteArray::fromBase64(&local_1c8,&this->challenge,0);
        challenge_00.m_data = (storage_type *)local_1c8.ptr;
        challenge_00.m_size = local_1c8.size;
        qGssapiContinue((QByteArray *)&local_b8,this,challenge_00);
        local_1a8._14_2_ = local_b8.targetName.maxLen;
        local_1a8._12_2_ = local_b8.targetName.len;
        local_1a8._8_4_ = local_b8.type;
        acVar4 = local_b8.magic;
        local_b8.magic[0] = '\0';
        local_b8.magic[1] = '\0';
        local_b8.magic[2] = '\0';
        local_b8.magic[3] = '\0';
        local_b8.magic[4] = '\0';
        local_b8.magic[5] = '\0';
        local_b8.magic[6] = '\0';
        local_b8.magic[7] = '\0';
        acVar5 = local_b8.magic;
        local_b8.type = 0;
        local_b8.targetName.len = 0;
        local_b8.targetName.maxLen = 0;
        local_b8.magic[0] = acVar4[0];
        local_b8.magic[1] = acVar4[1];
        local_b8.magic[2] = acVar4[2];
        local_b8.magic[3] = acVar4[3];
        local_b8.magic[4] = acVar4[4];
        local_b8.magic[5] = acVar4[5];
        local_b8.magic[6] = acVar4[6];
        local_b8.magic[7] = acVar4[7];
        local_1a8[0] = local_b8.magic[0];
        local_1a8[1] = local_b8.magic[1];
        local_1a8[2] = local_b8.magic[2];
        local_1a8[3] = local_b8.magic[3];
        local_1a8[4] = local_b8.magic[4];
        local_1a8[5] = local_b8.magic[5];
        local_1a8[6] = local_b8.magic[6];
        local_1a8[7] = local_b8.magic[7];
        lVar9 = CONCAT44(local_b8.flags,local_b8.targetName.offset);
        local_1a8._16_4_ = local_b8.targetName.offset;
        local_1a8._20_2_ = (undefined2)local_b8.flags;
        local_1a8._22_2_ = (undefined2)(local_b8.flags >> 0x10);
        local_b8.targetName.offset = 0;
        local_b8.flags = 0;
        local_b8.magic = acVar5;
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_b8);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_1c8);
        if (lVar9 != 0) {
          QByteArray::toBase64(&local_b8,(QArrayDataPointer<char> *)local_1a8,0);
          pDVar3 = local_328.d;
          pcVar13 = (char *)CONCAT26(local_b8.targetName.maxLen,
                                     CONCAT24(local_b8.targetName.len,local_b8.type));
          local_328.d = (Data *)local_b8.magic;
          local_b8.magic = (char  [8])pDVar3;
          local_b8.type = (quint32)local_328.ptr;
          local_b8.targetName.len = (quint16)((ulong)local_328.ptr >> 0x20);
          local_b8.targetName.maxLen = (quint16)((ulong)local_328.ptr >> 0x30);
          qVar1 = CONCAT44(local_b8.flags,local_b8.targetName.offset);
          local_b8.targetName.offset = (quint32)local_328.size;
          local_b8.flags = (quint32)((ulong)local_328.size >> 0x20);
          local_328.ptr = pcVar13;
          local_328.size = qVar1;
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_b8);
          this->phase = Done;
          QByteArray::operator=(&this->challenge,"");
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_1a8);
          break;
        }
      }
      this->phase = Done;
      QByteArray::QByteArray(__return_storage_ptr__,"",-1);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_1a8);
      goto LAB_0019a857;
    }
    local_1a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_1a8._8_4_ = 0xaaaaaaaa;
    local_1a8._12_2_ = 0xaaaa;
    local_1a8._14_2_ = 0xaaaa;
    if ((this->gssApiHandles).d == (QGssApiHandles *)0x0) {
      pQVar11 = (QGssApiHandles *)operator_new(0x10);
      pQVar11->gssCtx = (gss_ctx_id_t)0x0;
      QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_>::reset
                (&this->gssApiHandles,pQVar11);
    }
    host_00.m_data = in_stack_fffffffffffffcc0;
    host_00.m_size = in_stack_fffffffffffffcb8;
    pgVar12 = qGSsapiGetServiceName(host_00);
    if (pgVar12 == (gss_name_t)0x0) {
      lVar9 = 0;
      QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_>::reset
                (&this->gssApiHandles,(QGssApiHandles *)0x0);
      uVar18._0_1_ = '\0';
      uVar18._1_1_ = '\0';
      uVar18._2_1_ = '\0';
      uVar18._3_1_ = '\0';
      uVar19._0_1_ = '\0';
      uVar19._1_1_ = '\0';
      uVar19._2_1_ = '\0';
      uVar19._3_1_ = '\0';
      local_1a8._8_4_ = 0;
      local_1a8._12_2_ = 0;
      local_1a8._14_2_ = 0;
    }
    else {
      pQVar11 = (this->gssApiHandles).d;
      pQVar11->targetName = pgVar12;
      pQVar11->gssCtx = (gss_ctx_id_t)0x0;
      qGssapiContinue((QByteArray *)&local_b8,this,(QByteArrayView)ZEXT816(0));
      lVar9 = CONCAT44(local_b8.flags,local_b8.targetName.offset);
      uVar18 = local_b8.magic._0_4_;
      uVar19 = local_b8.magic._4_4_;
      local_1a8._8_4_ = local_b8.type;
      local_1a8._12_2_ = local_b8.targetName.len;
      local_1a8._14_2_ = local_b8.targetName.maxLen;
    }
    local_b8.magic[0] = '\0';
    local_b8.magic[1] = '\0';
    local_b8.magic[2] = '\0';
    local_b8.magic[3] = '\0';
    local_b8.magic[4] = '\0';
    local_b8.magic[5] = '\0';
    local_b8.magic[6] = '\0';
    local_b8.magic[7] = '\0';
    local_b8.type = 0;
    local_b8.targetName.len = 0;
    local_b8.targetName.maxLen = 0;
    local_1a8[4] = (char)uVar19;
    local_1a8[5] = SUB41(uVar19,1);
    local_1a8[6] = SUB41(uVar19,2);
    local_1a8[7] = SUB41(uVar19,3);
    local_1a8[0] = (char)uVar18;
    local_1a8[1] = SUB41(uVar18,1);
    local_1a8[2] = SUB41(uVar18,2);
    local_1a8[3] = SUB41(uVar18,3);
    local_1a8._16_4_ = (undefined4)lVar9;
    local_1a8._20_2_ = (undefined2)((ulong)lVar9 >> 0x20);
    local_1a8._22_2_ = (undefined2)((ulong)lVar9 >> 0x30);
    local_b8.targetName.offset = 0;
    local_b8.flags = 0;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_b8);
    if (lVar9 == 0) {
      this->phase = Done;
      QByteArray::QByteArray(__return_storage_ptr__,"",-1);
    }
    else {
      QByteArray::toBase64(&local_b8,local_1a8,0);
      pDVar3 = local_328.d;
      pcVar13 = (char *)CONCAT26(local_b8.targetName.maxLen,
                                 CONCAT24(local_b8.targetName.len,local_b8.type));
      local_328.d = (Data *)local_b8.magic;
      local_b8.magic = (char  [8])pDVar3;
      local_b8.type = (quint32)local_328.ptr;
      local_b8.targetName.len = (quint16)((ulong)local_328.ptr >> 0x20);
      local_b8.targetName.maxLen = (quint16)((ulong)local_328.ptr >> 0x30);
      qVar1 = CONCAT44(local_b8.flags,local_b8.targetName.offset);
      local_b8.targetName.offset = (quint32)local_328.size;
      local_b8.flags = (quint32)((ulong)local_328.size >> 0x20);
      local_328.ptr = pcVar13;
      local_328.size = qVar1;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_b8);
      this->phase = Phase2;
    }
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_1a8);
    if (lVar9 == 0) goto LAB_0019a857;
    break;
  case Ntlm:
    local_338 = QByteArrayView::lengthHelperCharArray("NTLM",5);
    pcStack_330 = "NTLM";
    if ((this->challenge).d.size == 0) {
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = (char16_t *)0x0;
      local_1c8.size = 0;
      local_b8.targetName.offset = 0xaaaaaaaa;
      local_b8.flags = 0xaaaaaaaa;
      local_b8.challenge[0] = 0xaa;
      local_b8.challenge[1] = 0xaa;
      local_b8.challenge[2] = 0xaa;
      local_b8.challenge[3] = 0xaa;
      local_b8.challenge[4] = 0xaa;
      local_b8.challenge[5] = 0xaa;
      local_b8.challenge[6] = 0xaa;
      local_b8.challenge[7] = 0xaa;
      local_b8.magic = (char  [8])&DAT_aaaaaaaaaaaaaaaa;
      local_b8.type = 0xaaaaaaaa;
      local_b8.targetName.len = 0xaaaa;
      local_b8.targetName.maxLen = 0xaaaa;
      QDataStream::QDataStream((QDataStream *)&local_b8,&local_1c8,2);
      QDataStream::setByteOrder((ByteOrder)&local_b8);
      local_1a8[0] = 'N';
      local_1a8[1] = 'T';
      local_1a8[2] = 'L';
      local_1a8[3] = 'M';
      local_1a8[4] = 'S';
      local_1a8[5] = 'S';
      local_1a8[6] = 'P';
      local_1a8[7] = '\0';
      local_1a8._8_4_ = 1;
      local_1a8._12_2_ = 0x8205;
      local_1a8._14_2_ = 8;
      local_1a8._16_4_ = 0;
      local_1a8._20_2_ = 0;
      local_1a8._22_2_ = 0;
      local_1a8._24_4_ = 0;
      local_1a8._28_4_ = 0;
      local_1a8._32_4_ = 0;
      QStack_184.len = 0;
      QStack_184.maxLen = 0;
      QStack_184.offset = 0;
      QStack_17c.len = 0;
      QStack_17c.maxLen = 0;
      QStack_17c.offset = 0;
      auStack_174._0_2_ = 0;
      auStack_174._2_2_ = 0;
      auStack_174._4_4_ = 0;
      uStack_16c = 0;
      local_168.d.d = (Data *)0x0;
      local_168.d.ptr = (char *)0x0;
      QDataStream::writeRawData(local_b8.magic,(longlong)local_1a8);
      QDataStream::operator<<((QDataStream *)&local_b8,local_1a8._8_4_);
      QDataStream::operator<<((QDataStream *)&local_b8,CONCAT22(local_1a8._14_2_,local_1a8._12_2_));
      ::operator<<((QDataStream *)&local_b8,(QNtlmBuffer *)(local_1a8 + 0x10));
      ::operator<<((QDataStream *)&local_b8,(QNtlmBuffer *)(local_1a8 + 0x18));
      if (CONCAT44(auStack_174._0_4_,QStack_17c.offset) != 0) {
        qStreamNtlmString((QDataStream *)&local_b8,(QString *)(local_1a8 + 0x20),true);
      }
      if ((Data *)local_168.d.ptr != (Data *)0x0) {
        qStreamNtlmString((QDataStream *)&local_b8,(QString *)(auStack_174 + 4),true);
      }
      QNtlmPhase1Block::~QNtlmPhase1Block((QNtlmPhase1Block *)local_1a8);
      QDataStream::~QDataStream((QDataStream *)&local_b8);
      QByteArray::toBase64((QArrayDataPointer<char> *)local_1a8,&local_1c8,0);
      pDVar3 = local_328.d;
      pcVar13 = (char *)CONCAT26(local_1a8._14_2_,CONCAT24(local_1a8._12_2_,local_1a8._8_4_));
      local_328.d = (Data *)local_1a8._0_8_;
      local_1a8._0_8_ = pDVar3;
      local_1a8._8_4_ = SUB84(local_328.ptr,0);
      local_1a8._12_2_ = (undefined2)((ulong)local_328.ptr >> 0x20);
      local_1a8._14_2_ = (undefined2)((ulong)local_328.ptr >> 0x30);
      qVar1 = CONCAT26(local_1a8._22_2_,CONCAT24(local_1a8._20_2_,local_1a8._16_4_));
      local_1a8._16_4_ = (undefined4)local_328.size;
      local_1a8._20_2_ = (undefined2)((ulong)local_328.size >> 0x20);
      local_1a8._22_2_ = (undefined2)((ulong)local_328.size >> 0x30);
      local_328.ptr = pcVar13;
      local_328.size = qVar1;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_1a8);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_1c8);
      if ((this->user).d.size == 0) {
        this->phase = Done;
      }
      else {
        this->phase = Phase2;
      }
    }
    else {
      QByteArray::fromBase64(&local_380,&this->challenge,0);
      local_b8.magic[0] = '\0';
      local_b8.magic[1] = '\0';
      local_b8.magic[2] = '\0';
      local_b8.magic[3] = '\0';
      local_b8.magic[4] = '\0';
      local_b8.magic[5] = '\0';
      local_b8.magic[6] = '\0';
      local_b8.magic[7] = '\0';
      local_b8.type = 0xffffffff;
      local_b8.targetName.len = 0;
      local_b8.targetName.maxLen = 0;
      local_b8.targetName.offset = 0;
      local_b8.flags = 0;
      local_b8.challenge[0] = '\0';
      local_b8.challenge[1] = '\0';
      local_b8.challenge[2] = '\0';
      local_b8.challenge[3] = '\0';
      local_b8.challenge[4] = '\0';
      local_b8.challenge[5] = '\0';
      local_b8.challenge[6] = '\0';
      local_b8.challenge[7] = '\0';
      local_b8.context[0] = 0;
      local_b8.context[1] = 0;
      local_b8.targetInfo.len = 0;
      local_b8.targetInfo.maxLen = 0;
      local_b8.targetInfo.offset = 0;
      local_b8.targetNameStr.d.d._0_4_ = 0;
      local_b8.targetNameStr.d.d._4_4_ = 0;
      local_b8.targetNameStr.d.ptr._0_4_ = 0;
      local_b8.targetNameStr.d.ptr._4_4_ = 0;
      local_b8.targetNameStr.d.size._0_4_ = 0;
      local_b8.targetNameStr.d.size._4_4_ = 0;
      local_b8.targetInfoStr.d.d._0_4_ = 0;
      local_b8.targetInfoStr.d._4_8_ = 0;
      local_b8.targetInfoStr.d._12_8_ = 0;
      local_b8.targetInfoStr.d.size._4_4_ = 0;
      local_b8.targetInfoBuff.d.d._0_4_ = 0;
      local_b8.targetInfoBuff.d.d._4_4_ = 0;
      local_b8.targetInfoBuff.d.ptr._0_4_ = 0;
      local_b8.targetInfoBuff.d.ptr._4_4_ = 0;
      local_b8.targetInfoBuff.d.size = 0;
      if (CONCAT44(local_380.size._4_4_,(uint)local_380.size) < 0x30) {
LAB_0019a467:
        local_368.d = (Data *)0x0;
        local_368.ptr = (char *)0x0;
        local_368.size = 0;
      }
      else {
        local_1a8._16_4_ = 0xaaaaaaaa;
        local_1a8._20_2_ = 0xaaaa;
        local_1a8._22_2_ = 0xaaaa;
        local_1a8._24_4_ = 0xaaaaaaaa;
        local_1a8._28_4_ = 0xaaaaaaaa;
        local_1a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_1a8._8_4_ = 0xaaaaaaaa;
        local_1a8._12_2_ = 0xaaaa;
        local_1a8._14_2_ = 0xaaaa;
        QDataStream::QDataStream((QDataStream *)local_1a8,(QByteArray *)&local_380);
        QDataStream::setByteOrder((ByteOrder)(QDataStream *)local_1a8);
        lVar9 = QDataStream::readRawData((char *)local_1a8,(longlong)&local_b8);
        if (((lVar9 < 8) || (local_b8.magic != (char  [8])0x5053534d4c544e)) ||
           (QDataStream::operator>>((QDataStream *)local_1a8,(int *)&local_b8.type),
           local_b8.type != 2)) {
LAB_0019a45a:
          QDataStream::~QDataStream((QDataStream *)local_1a8);
          goto LAB_0019a467;
        }
        ::operator>>((QDataStream *)local_1a8,&local_b8.targetName);
        QDataStream::operator>>((QDataStream *)local_1a8,(int *)&local_b8.flags);
        lVar9 = QDataStream::readRawData((char *)local_1a8,(longlong)local_b8.challenge);
        if (lVar9 < 8) goto LAB_0019a45a;
        this_00 = (QDataStream *)
                  QDataStream::operator>>((QDataStream *)local_1a8,(int *)local_b8.context);
        QDataStream::operator>>(this_00,(int *)(local_b8.context + 1));
        ::operator>>((QDataStream *)local_1a8,&local_b8.targetInfo);
        if (local_b8.targetName.len != 0) {
          if (CONCAT44(local_380.size._4_4_,(uint)local_380.size) <
              (ulong)(local_b8.targetName.offset + local_b8.targetName.len)) goto LAB_0019a45a;
          QByteArray::mid((longlong)&local_1e8,(longlong)&local_380);
          QByteArray::data((QByteArray *)&local_1e8);
          pQVar10 = (QChar *)QByteArray::data((QByteArray *)&local_1e8);
          QString::QString((QString *)&local_1c8,pQVar10,(ulong)local_1e8.size >> 1);
          pQVar2 = (QAuthenticatorPrivate *)
                   CONCAT44(local_b8.targetNameStr.d.d._4_4_,local_b8.targetNameStr.d.d._0_4_);
          pDVar14 = (Data *)CONCAT44(local_b8.targetNameStr.d.ptr._4_4_,
                                     local_b8.targetNameStr.d.ptr._0_4_);
          local_b8.targetNameStr.d.d._0_4_ = SUB84(local_1c8.d,0);
          local_b8.targetNameStr.d.d._4_4_ = (undefined4)((ulong)local_1c8.d >> 0x20);
          local_b8.targetNameStr.d.ptr._0_4_ = SUB84(local_1c8.ptr,0);
          local_b8.targetNameStr.d.ptr._4_4_ = (undefined4)((ulong)local_1c8.ptr >> 0x20);
          pQVar17 = (QString *)
                    CONCAT44(local_b8.targetNameStr.d.size._4_4_,
                             (undefined4)local_b8.targetNameStr.d.size);
          local_b8.targetNameStr.d.size._0_4_ = (undefined4)local_1c8.size;
          local_b8.targetNameStr.d.size._4_4_ = (undefined4)((ulong)local_1c8.size >> 0x20);
          local_1c8.d = (Data *)pQVar2;
          local_1c8.ptr = (char16_t *)pDVar14;
          local_1c8.size = (qsizetype)pQVar17;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_1e8);
        }
        if (local_b8.targetInfo.len != 0) {
          if ((uint)local_380.size < local_b8.targetInfo.offset + local_b8.targetInfo.len)
          goto LAB_0019a45a;
          QByteArray::mid((longlong)&local_1c8,(longlong)&local_380);
          qVar1 = local_b8.targetInfoBuff.d.size;
          pQVar2 = (QAuthenticatorPrivate *)
                   CONCAT44(local_b8.targetInfoBuff.d.d._4_4_,local_b8.targetInfoBuff.d.d._0_4_);
          pDVar14 = (Data *)CONCAT44(local_b8.targetInfoBuff.d.ptr._4_4_,
                                     local_b8.targetInfoBuff.d.ptr._0_4_);
          local_b8.targetInfoBuff.d.d._0_4_ = SUB84(local_1c8.d,0);
          local_b8.targetInfoBuff.d.d._4_4_ = (undefined4)((ulong)local_1c8.d >> 0x20);
          local_b8.targetInfoBuff.d.ptr._0_4_ = SUB84(local_1c8.ptr,0);
          local_b8.targetInfoBuff.d.ptr._4_4_ = (undefined4)((ulong)local_1c8.ptr >> 0x20);
          local_b8.targetInfoBuff.d.size = local_1c8.size;
          local_1c8.size = qVar1;
          local_1c8.d = (Data *)pQVar2;
          local_1c8.ptr = (char16_t *)pDVar14;
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_1c8);
        }
        QDataStream::~QDataStream((QDataStream *)local_1a8);
        local_368.size = 0;
        local_368.d = (Data *)0x0;
        local_368.ptr = (char *)0x0;
        local_1f8 = 0xaaaaaaaa;
        uStack_1f4 = 0xaaaaaaaa;
        uStack_1f0 = 0xaaaaaaaa;
        uStack_1ec = 0xaaaaaaaa;
        local_208 = 0xaaaaaaaa;
        uStack_204 = 0xaaaaaaaa;
        uStack_200 = 0xaaaaaaaa;
        uStack_1fc = 0xaaaaaaaa;
        QDataStream::QDataStream((QDataStream *)&local_208,&local_368,2);
        QDataStream::setByteOrder((ByteOrder)(QDataStream *)&local_208);
        local_1a8[0] = 'N';
        local_1a8[1] = 'T';
        local_1a8[2] = 'L';
        local_1a8[3] = 'M';
        local_1a8[4] = 'S';
        local_1a8[5] = 'S';
        local_1a8[6] = 'P';
        local_1a8[7] = '\0';
        local_1a8._8_4_ = 3;
        local_1a8._12_2_ = 0;
        local_1a8._14_2_ = 0;
        local_1a8._16_4_ = 0;
        local_1a8._20_2_ = 0;
        local_1a8._22_2_ = 0;
        local_1a8._24_4_ = 0;
        local_1a8._28_4_ = 0;
        local_1a8._32_4_ = 0;
        QStack_184.len = 0;
        QStack_184.maxLen = 0;
        QStack_184.offset = 0;
        QStack_17c.len = 0;
        QStack_17c.maxLen = 0;
        QStack_17c.offset = 0;
        auStack_174._0_2_ = 0;
        auStack_174._2_2_ = 0;
        auStack_174._4_4_ = 0;
        memset(&local_168,0,0xa8);
        uVar16 = local_b8.flags & 1;
        uStack_16c = (local_b8.flags & 0x88000) + uVar16 * 2 ^ 0x800203;
        if (((this->userDomain).d.size != 0) ||
           (bVar6 = QString::contains(&this->extractedUser,(QChar)0x40,CaseSensitive), bVar6)) {
          pQVar17 = &this->userDomain;
        }
        else {
          pQVar17 = &local_b8.targetNameStr;
        }
        bVar6 = SUB41(uVar16,0);
        iVar8 = qEncodeNtlmString((QNtlmBuffer *)(local_1a8 + 0x1c),0x40,pQVar17,bVar6);
        QString::operator=(&local_138,(QString *)pQVar17);
        iVar8 = qEncodeNtlmString(&QStack_184,iVar8,&this->extractedUser,bVar6);
        QString::operator=(&local_120,(QString *)&this->extractedUser);
        iVar8 = qEncodeNtlmString(&QStack_17c,iVar8,&this->workstation,bVar6);
        QString::operator=(local_108,(QString *)&this->workstation);
        qVar1 = local_168.d.size;
        pcVar13 = local_168.d.ptr;
        pDVar3 = local_168.d.d;
        if (local_b8.targetInfo.len == 0) {
          qCreatev2Hash((QByteArray *)&local_1c8,this,(QNtlmPhase3Block *)local_1a8);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_1c8);
          local_1e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_1e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_1e8.ptr = &DAT_aaaaaaaaaaaaaaaa;
          QByteArray::QByteArray((QByteArray *)&local_1e8,(char *)local_b8.challenge,8);
          local_228.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_228.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_228.ptr = &DAT_aaaaaaaaaaaaaaaa;
          clientChallenge((QByteArray *)&local_228,this);
          QByteArray::append((QByteArray *)&local_1e8);
          this_02 = &local_248;
          local_248.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_248.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          local_248.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          message.m_data = local_1e8.ptr;
          message.m_size = local_1e8.size;
          qEncodeHmacMd5((QByteArray *)this_02,&local_d8,message);
          QByteArray::append((QByteArray *)this_02);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_228);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_1e8);
          qVar1 = local_168.d.size;
          pcVar13 = local_168.d.ptr;
          pDVar3 = local_168.d.d;
          local_168.d.d = (Data *)local_248.d;
          local_168.d.ptr = (char *)local_248.ptr;
          local_248.d = (Data *)pDVar3;
          local_248.ptr = (char16_t *)pcVar13;
          local_168.d.size = local_248.size;
          local_248.size = qVar1;
        }
        else {
          local_168.d.d = (Data *)0x0;
          local_168.d.ptr = (char *)0x0;
          this_02 = &local_1c8;
          local_1c8.d = (Data *)pDVar3;
          local_1c8.ptr = (char16_t *)pcVar13;
          local_168.d.size = 0;
          local_1c8.size = qVar1;
        }
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)this_02);
        uVar7 = (ushort)local_168.d.size;
        local_1a8._16_4_ = iVar8 + 1U & 0xfffffffe;
        local_1a8._12_2_ = uVar7;
        local_1a8._14_2_ = uVar7;
        qCreatev2Hash((QByteArray *)&local_228,this,(QNtlmPhase3Block *)local_1a8);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_228);
        local_248.size = 0;
        local_248.d = (Data *)0x0;
        local_248.ptr = (char16_t *)0x0;
        local_1e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        uStack_1d0 = 0xaaaaaaaa;
        uStack_1cc = 0xaaaaaaaa;
        local_1e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_1e8.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QDataStream::QDataStream((QDataStream *)&local_1e8,&local_248,2);
        QDataStream::setByteOrder((ByteOrder)&local_1e8);
        QDataStream::operator<<((QDataStream *)&local_1e8,1);
        QDataStream::operator<<((QDataStream *)&local_1e8,1);
        local_268.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_268.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_268.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::QByteArray((QByteArray *)&local_268,6,'\0');
        pcVar13 = local_268.ptr;
        if (local_268.ptr == (char *)0x0) {
          pcVar13 = (char *)&QByteArray::_empty;
        }
        QDataStream::writeRawData((char *)&local_1e8,(longlong)pcVar13);
        local_288.size = 0;
        local_288.d = (Data *)0x0;
        local_288.ptr = (char *)0x0;
        if (local_b8.targetInfo.len == 0) {
LAB_0019addb:
          lVar9 = QDateTime::currentSecsSinceEpoch();
          QDataStream::operator<<((QDataStream *)&local_1e8,lVar9 * 10000000 + 0x19db1ded53e8000);
        }
        else {
          local_2a8.size = 0;
          local_2a8.d = (Data *)0x0;
          local_2a8.ptr = (char *)0x0;
          local_1c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          puStack_1b0 = &DAT_aaaaaaaaaaaaaaaa;
          local_1c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_1c8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QDataStream::QDataStream((QDataStream *)&local_1c8,&local_b8.targetInfoBuff);
          QDataStream::setByteOrder((ByteOrder)&local_1c8);
          _avId = (Data *)CONCAT62(uStack_2c6,0xaaaa);
          local_2e8.d = (Data *)CONCAT62(local_2e8.d._2_6_,0xaaaa);
          while( true ) {
            QDataStream::operator>>((QDataStream *)&local_1c8,(short *)&avId);
            QDataStream::operator>>((QDataStream *)&local_1c8,(short *)&local_2e8);
            if (avId == 0) break;
            if (avId == 7) {
              QByteArray::resize((longlong)&local_2a8);
              pcVar13 = QByteArray::data((QByteArray *)&local_2a8);
              QDataStream::readRawData((char *)&local_1c8,(longlong)pcVar13);
              break;
            }
            QDataStream::skipRawData((longlong)&local_1c8);
          }
          QDataStream::~QDataStream((QDataStream *)&local_1c8);
          qVar1 = local_2a8.size;
          pcVar13 = local_2a8.ptr;
          local_288.d = local_2a8.d;
          local_2a8.d = (Data *)0x0;
          local_288.ptr = local_2a8.ptr;
          local_2a8.ptr = (char *)0x0;
          local_2a8.size = 0;
          local_288.size = qVar1;
          QArrayDataPointer<char>::~QArrayDataPointer(&local_2a8);
          if (qVar1 == 0) goto LAB_0019addb;
          if (pcVar13 == (char *)0x0) {
            pcVar13 = (char *)&QByteArray::_empty;
          }
          QDataStream::writeRawData((char *)&local_1e8,(longlong)pcVar13);
        }
        local_1c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_1c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_1c8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        clientChallenge((QByteArray *)&local_1c8,this);
        pDVar14 = (Data *)local_1c8.ptr;
        if ((Data *)local_1c8.ptr == (Data *)0x0) {
          pDVar14 = (Data *)&QByteArray::_empty;
        }
        QDataStream::writeRawData((char *)&local_1e8,(longlong)pDVar14);
        local_2a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_2a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_2a8.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::QByteArray((QByteArray *)&local_2a8,4,'\0');
        pcVar13 = local_2a8.ptr;
        if (local_2a8.ptr == (char *)0x0) {
          pcVar13 = (char *)&QByteArray::_empty;
        }
        QDataStream::writeRawData((char *)&local_1e8,(longlong)pcVar13);
        if (local_b8.targetInfo.len != 0) {
          puVar15 = (undefined8 *)
                    CONCAT44(local_b8.targetInfoBuff.d.ptr._4_4_,local_b8.targetInfoBuff.d.ptr._0_4_
                            );
          if (puVar15 == (undefined8 *)0x0) {
            puVar15 = &QByteArray::_empty;
          }
          QDataStream::writeRawData((char *)&local_1e8,(longlong)puVar15);
        }
        local_2b8 = &DAT_aaaaaaaaaaaaaaaa;
        _avId = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        pcStack_2c0 = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::QByteArray((QByteArray *)&avId,4,'\0');
        pcVar13 = pcStack_2c0;
        if (pcStack_2c0 == (char *)0x0) {
          pcVar13 = (char *)&QByteArray::_empty;
        }
        QDataStream::writeRawData((char *)&local_1e8,(longlong)pcVar13);
        local_2e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_2e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_2e8.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::QByteArray((QByteArray *)&local_2e8,(char *)local_b8.challenge,8);
        QByteArray::append((QByteArray *)&local_2e8);
        local_308.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_308.ptr = &DAT_aaaaaaaaaaaaaaaa;
        local_308.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        message_00.m_data = local_2e8.ptr;
        message_00.m_size = local_2e8.size;
        qEncodeHmacMd5((QByteArray *)&local_308,&local_d8,message_00);
        QByteArray::append((QByteArray *)&local_308);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_2e8);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&avId);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_2a8);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_1c8);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_288);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_268);
        QDataStream::~QDataStream((QDataStream *)&local_1e8);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_248);
        qVar1 = local_150.d.size;
        pcVar13 = local_150.d.ptr;
        pDVar3 = local_150.d.d;
        local_150.d.d = local_308.d;
        local_150.d.ptr = local_308.ptr;
        local_308.d = pDVar3;
        local_308.ptr = pcVar13;
        local_150.d.size = local_308.size;
        local_308.size = qVar1;
        QArrayDataPointer<char>::~QArrayDataPointer(&local_308);
        uVar16 = uStack_16c;
        local_1a8._20_2_ = (quint16)local_150.d.size;
        local_1a8._22_2_ = (quint16)local_150.d.size;
        local_1a8._24_4_ = (uint)uVar7 + (iVar8 + 1U | 1) & 0xfffffffe;
        QDataStream::writeRawData((char *)&local_208,(longlong)local_1a8);
        QDataStream::operator<<((QDataStream *)&local_208,local_1a8._8_4_);
        ::operator<<((QDataStream *)&local_208,(QNtlmBuffer *)(local_1a8 + 0xc));
        ::operator<<((QDataStream *)&local_208,(QNtlmBuffer *)(local_1a8 + 0x14));
        ::operator<<((QDataStream *)&local_208,(QNtlmBuffer *)(local_1a8 + 0x1c));
        ::operator<<((QDataStream *)&local_208,&QStack_184);
        ::operator<<((QDataStream *)&local_208,&QStack_17c);
        ::operator<<((QDataStream *)&local_208,(QNtlmBuffer *)auStack_174);
        QDataStream::operator<<((QDataStream *)&local_208,uStack_16c);
        if (local_138.d.size != 0) {
          qStreamNtlmString((QDataStream *)&local_208,&local_138,(bool)((byte)uVar16 & 1));
        }
        bVar6 = (bool)((byte)uVar16 & 1);
        qStreamNtlmString((QDataStream *)&local_208,&local_120,bVar6);
        if (local_108[0].d.size != 0) {
          qStreamNtlmString((QDataStream *)&local_208,local_108,bVar6);
        }
        qStreamNtlmBuffer((QDataStream *)&local_208,&local_168);
        qStreamNtlmBuffer((QDataStream *)&local_208,&local_150);
        QNtlmPhase3Block::~QNtlmPhase3Block((QNtlmPhase3Block *)local_1a8);
        QDataStream::~QDataStream((QDataStream *)&local_208);
      }
      QNtlmPhase2Block::~QNtlmPhase2Block(&local_b8);
      QByteArray::toBase64((QArrayDataPointer<char> *)local_1a8,&local_368,0);
      pDVar3 = local_328.d;
      pcVar13 = (char *)CONCAT26(local_1a8._14_2_,CONCAT24(local_1a8._12_2_,local_1a8._8_4_));
      local_328.d = (Data *)local_1a8._0_8_;
      local_1a8._0_8_ = pDVar3;
      local_1a8._8_4_ = SUB84(local_328.ptr,0);
      local_1a8._12_2_ = (undefined2)((ulong)local_328.ptr >> 0x20);
      local_1a8._14_2_ = (undefined2)((ulong)local_328.ptr >> 0x30);
      qVar1 = CONCAT26(local_1a8._22_2_,CONCAT24(local_1a8._20_2_,local_1a8._16_4_));
      local_1a8._16_4_ = (undefined4)local_328.size;
      local_1a8._20_2_ = (undefined2)((ulong)local_328.size >> 0x20);
      local_1a8._22_2_ = (undefined2)((ulong)local_328.size >> 0x30);
      local_328.ptr = pcVar13;
      local_328.size = qVar1;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_1a8);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_368);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_380);
      this->phase = Done;
      QByteArray::operator=(&this->challenge,"");
    }
    break;
  case DigestMd5:
    local_338 = QByteArrayView::lengthHelperCharArray("Digest",7);
    pcStack_330 = "Digest";
    this_01 = (QNtlmPhase2Block *)local_1a8;
    challenge.m_data = (this->challenge).d.ptr;
    challenge.m_size = (this->challenge).d.size;
    digestMd5Response((QByteArray *)this_01,this,challenge,requestMethod,path);
    pDVar3 = local_328.d;
    pcVar13 = (char *)CONCAT26(local_1a8._14_2_,CONCAT24(local_1a8._12_2_,local_1a8._8_4_));
    local_328.d = (Data *)local_1a8._0_8_;
    local_1a8._0_8_ = pDVar3;
    local_1a8._8_4_ = SUB84(local_328.ptr,0);
    local_1a8._12_2_ = (undefined2)((ulong)local_328.ptr >> 0x20);
    local_1a8._14_2_ = (undefined2)((ulong)local_328.ptr >> 0x30);
    qVar1 = CONCAT26(local_1a8._22_2_,CONCAT24(local_1a8._20_2_,local_1a8._16_4_));
    local_1a8._16_4_ = (undefined4)local_328.size;
    local_1a8._20_2_ = (undefined2)((ulong)local_328.size >> 0x20);
    local_1a8._22_2_ = (undefined2)((ulong)local_328.size >> 0x30);
    local_328.ptr = pcVar13;
    local_328.size = qVar1;
LAB_0019a09d:
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)this_01);
switchD_00199f67_caseD_0:
    this->phase = Done;
  }
  local_1a8._0_8_ = &local_338;
  local_1a8[8] = 0x20;
  local_1a8._16_4_ = SUB84(&local_328,0);
  local_1a8._20_2_ = (undefined2)((ulong)&local_328 >> 0x20);
  local_1a8._22_2_ = (undefined2)((ulong)&local_328 >> 0x30);
  QStringBuilder<QStringBuilder<QByteArrayView_&,_char>,_QByteArray_&>::convertTo<QByteArray>
            (__return_storage_ptr__,
             (QStringBuilder<QStringBuilder<QByteArrayView_&,_char>,_QByteArray_&> *)local_1a8);
LAB_0019a857:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_328);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QAuthenticatorPrivate::calculateResponse(QByteArrayView requestMethod,
                                                    QByteArrayView path, QStringView host)
{
#if !QT_CONFIG(sspi) && !QT_CONFIG(gssapi)
    Q_UNUSED(host);
#endif
    QByteArray response;
    QByteArrayView methodString;
    switch(method) {
    case QAuthenticatorPrivate::None:
        phase = Done;
        break;
    case QAuthenticatorPrivate::Basic:
        methodString = "Basic";
        response = (user + ':'_L1 + password).toLatin1().toBase64();
        phase = Done;
        break;
    case QAuthenticatorPrivate::DigestMd5:
        methodString = "Digest";
        response = digestMd5Response(challenge, requestMethod, path);
        phase = Done;
        break;
    case QAuthenticatorPrivate::Ntlm:
        methodString = "NTLM";
        if (challenge.isEmpty()) {
#if QT_CONFIG(sspi) // SSPI
            QByteArray phase1Token;
            if (user.isEmpty()) { // Only pull from system if no user was specified in authenticator
                phase1Token = qSspiStartup(this, method, host);
            } else if (!q_SSPI_library_load()) {
                // Since we're not running qSspiStartup we have to make sure the library is loaded
                qWarning("Failed to load the SSPI libraries");
                return "";
            }
            if (!phase1Token.isEmpty()) {
                response = phase1Token.toBase64();
                phase = Phase2;
            } else
#endif
            {
                response = qNtlmPhase1().toBase64();
                if (user.isEmpty())
                    phase = Done;
                else
                    phase = Phase2;
            }
        } else {
#if QT_CONFIG(sspi) // SSPI
            QByteArray phase3Token;
            if (sspiWindowsHandles)
                phase3Token = qSspiContinue(this, method, host, QByteArray::fromBase64(challenge));
            if (!phase3Token.isEmpty()) {
                response = phase3Token.toBase64();
                phase = Done;
            } else
#endif
            {
                response = qNtlmPhase3(this, QByteArray::fromBase64(challenge)).toBase64();
                phase = Done;
            }
            challenge = "";
        }

        break;
    case QAuthenticatorPrivate::Negotiate:
        methodString = "Negotiate";
        if (challenge.isEmpty()) {
            QByteArray phase1Token;
#if QT_CONFIG(sspi) // SSPI
            phase1Token = qSspiStartup(this, method, host);
#elif QT_CONFIG(gssapi) // GSSAPI
            phase1Token = qGssapiStartup(this, host);
#endif

            if (!phase1Token.isEmpty()) {
                response = phase1Token.toBase64();
                phase = Phase2;
            } else {
                phase = Done;
                return "";
            }
        } else {
            QByteArray phase3Token;
#if QT_CONFIG(sspi) // SSPI
            if (sspiWindowsHandles)
                phase3Token = qSspiContinue(this, method, host, QByteArray::fromBase64(challenge));
#elif QT_CONFIG(gssapi) // GSSAPI
            if (gssApiHandles)
                phase3Token = qGssapiContinue(this, QByteArray::fromBase64(challenge));
#endif
            if (!phase3Token.isEmpty()) {
                response = phase3Token.toBase64();
                phase = Done;
                challenge = "";
            } else {
                phase = Done;
                return "";
            }
        }

        break;
    }

    return methodString + ' ' + response;
}